

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

bool __thiscall Am_Value::operator!=(Am_Value *this,long test_value)

{
  ushort uVar1;
  bool bVar2;
  double dVar3;
  
  uVar1 = this->type;
  if (uVar1 < 0x4000) {
    if (uVar1 - 2 < 2) {
LAB_00227abf:
      return (this->value).wrapper_value != (Am_Wrapper *)test_value;
    }
    if (uVar1 != 5) {
      return true;
    }
    bVar2 = (float)test_value != (this->value).float_value;
  }
  else {
    if (uVar1 != 0x8006) {
      if (uVar1 != 0x4000) {
        return true;
      }
      goto LAB_00227abf;
    }
    dVar3 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value);
    bVar2 = (double)test_value != dVar3;
  }
  return (bool)(-bVar2 & 1);
}

Assistant:

bool
Am_Value::operator!=(long test_value) const
{
  switch (type) {
  case Am_LONG:
  case Am_INT:
  case Am_ENUM:
    return value.long_value != test_value;
  case Am_FLOAT:
    return value.float_value != test_value;
  case Am_DOUBLE:
    return (double)*(Am_Double_Data *)value.wrapper_value != test_value;
  default:
    return true;
  }
}